

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlayout.cpp
# Opt level: O0

void QLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QMargins *margins;
  SizeConstraint SVar2;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QMargins QVar3;
  void *_v_1;
  void *_v;
  QLayout *_t;
  undefined4 in_stack_ffffffffffffffb0;
  QLayout *in_stack_ffffffffffffffb8;
  QLayout *in_stack_ffffffffffffffc0;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 1) {
    in_stack_ffffffffffffffc0 = (QLayout *)*in_RCX;
    if (in_EDX == 0) {
      SVar2 = (**(code **)(*in_RDI + 0x60))();
      *(SizeConstraint *)in_stack_ffffffffffffffc0 = SVar2;
    }
    else if (in_EDX == 1) {
      QVar3 = contentsMargins(in_stack_ffffffffffffffb8);
      local_18 = QVar3._0_8_;
      *(undefined8 *)in_stack_ffffffffffffffc0 = local_18;
      local_10 = QVar3._8_8_;
      *(undefined8 *)&in_stack_ffffffffffffffc0->field_0x8 = local_10;
    }
    else if (in_EDX == 2) {
      SVar2 = sizeConstraint((QLayout *)CONCAT44(2,in_stack_ffffffffffffffb0));
      *(SizeConstraint *)in_stack_ffffffffffffffc0 = SVar2;
    }
  }
  if (in_ESI == 2) {
    margins = (QMargins *)*in_RCX;
    if (in_EDX == 0) {
      (**(code **)(*in_RDI + 0x68))(in_RDI,(margins->m_left).m_i);
    }
    else if (in_EDX == 1) {
      setContentsMargins(in_stack_ffffffffffffffc0,margins);
    }
    else if (in_EDX == 2) {
      setSizeConstraint(in_stack_ffffffffffffffc0,(SizeConstraint)((ulong)margins >> 0x20));
    }
  }
  if ((in_ESI == 3) && (in_EDX == 1)) {
    unsetContentsMargins((QLayout *)0x340059);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLayout *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->spacing(); break;
        case 1: *reinterpret_cast<QMargins*>(_v) = _t->contentsMargins(); break;
        case 2: *reinterpret_cast<SizeConstraint*>(_v) = _t->sizeConstraint(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSpacing(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setContentsMargins(*reinterpret_cast<QMargins*>(_v)); break;
        case 2: _t->setSizeConstraint(*reinterpret_cast<SizeConstraint*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->unsetContentsMargins(); break;
        default: break;
        }
    }
}